

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EDX;
  bool skipheader;
  sigaction sa;
  string local_108;
  string local_e8;
  sigaction local_c8;
  
  skipheader = false;
  do {
    while (iVar1 = getopt(argc,argv,"vhs"), 0x72 < iVar1) {
      if (iVar1 == 0x73) {
        skipheader = true;
      }
      else if (iVar1 == 0x76) goto LAB_0010156b;
    }
    if (iVar1 == -1) {
      progname = *argv;
      memset(&local_c8,0,0x98);
      sigemptyset(&local_c8.sa_mask);
      local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
      local_c8.sa_flags = 4;
      sigaction(0xb,&local_c8,(sigaction *)0x0);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      initstreams(&local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      fmprogrammetocsv::doit(skipheader);
      return 0;
    }
  } while (iVar1 != 0x68);
  main_cold_1();
LAB_0010156b:
  main_cold_2();
  if (extraout_EDX == 1) {
    main_cold_3();
  }
  _Unwind_Resume();
}

Assistant:

int main(int argc, char *argv[]) {
    int opt;
    bool skipheader = false;
    while ((opt = getopt(argc, argv, "vhs")) != -1) {
        switch (opt) {
        case 's':
            skipheader = true;
            break;
        case 'v':
            fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
            exit(EXIT_FAILURE);
            break;
        case 'h':
            help();
            exit(EXIT_FAILURE);
        }
    }

    progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
    struct sigaction sa;

    memset(&sa, 0, sizeof(struct sigaction));
    sigemptyset(&sa.sa_mask);
    sa.sa_sigaction = segfault_sigaction;
    sa.sa_flags = SA_SIGINFO;

    sigaction(SIGSEGV, &sa, NULL);
#endif
    try {
        initstreams();
        fmprogrammetocsv::doit(skipheader);
    } catch (std::bad_alloc&) {
        fprintf(stderr, "%s: Memory allocation failed\n", progname);
        exit(EXIT_FAILURE);
    }
    return EXIT_SUCCESS;
}